

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_add_image(nk_draw_list *list,nk_image texture,nk_rect rect,nk_color color)

{
  nk_vec2 c;
  nk_vec2 uva;
  nk_vec2 uvc;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  if (list != (nk_draw_list *)0x0) {
    nk_draw_list_push_image(list,texture.handle);
    local_28 = rect.x;
    fStack_24 = rect.y;
    local_38 = rect.w;
    fStack_34 = rect.h;
    if (texture.h == 0 && texture.w == 0) {
      fVar3 = 1.0;
      fVar4 = 1.0;
      fVar1 = 0.0;
      fVar2 = 0.0;
    }
    else {
      fVar1 = (float)texture.region[0] / (float)texture.w;
      fVar2 = (float)texture.region[1] / (float)texture.h;
      fVar3 = (float)((uint)texture.region[2] + (uint)texture.region[0]) / (float)texture.w;
      fVar4 = (float)((uint)texture.region[3] + (uint)texture.region[1]) / (float)texture.h;
    }
    c.y = fStack_24 + fStack_34;
    c.x = local_28 + local_38;
    uva.y = fVar2;
    uva.x = fVar1;
    uvc.y = fVar4;
    uvc.x = fVar3;
    nk_draw_list_push_rect_uv(list,rect._0_8_,c,uva,uvc,color);
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x27fa,
                "void nk_draw_list_add_image(struct nk_draw_list *, struct nk_image, struct nk_rect, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_draw_list_add_image(struct nk_draw_list *list, struct nk_image texture,
    struct nk_rect rect, struct nk_color color)
{
    NK_ASSERT(list);
    if (!list) return;
    /* push new command with given texture */
    nk_draw_list_push_image(list, texture.handle);
    if (nk_image_is_subimage(&texture)) {
        /* add region inside of the texture  */
        struct nk_vec2 uv[2];
        uv[0].x = (float)texture.region[0]/(float)texture.w;
        uv[0].y = (float)texture.region[1]/(float)texture.h;
        uv[1].x = (float)(texture.region[0] + texture.region[2])/(float)texture.w;
        uv[1].y = (float)(texture.region[1] + texture.region[3])/(float)texture.h;
        nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h),  uv[0], uv[1], color);
    } else nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h),
            nk_vec2(0.0f, 0.0f), nk_vec2(1.0f, 1.0f),color);
}